

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  uint uVar3;
  wchar_t wVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  
  uVar11 = *(uint *)this;
  pwVar1 = *it + *(uint *)(this + 4);
  pwVar2 = pwVar1;
  if (uVar11 < 100) {
    bVar12 = false;
  }
  else {
    iVar5 = -1;
    uVar6 = 1;
    iVar7 = -2;
    uVar8 = 2;
    do {
      uVar3 = uVar11;
      uVar9 = (ulong)((uVar3 % 100) * 2);
      pwVar2[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar9 + 1];
      lVar10 = -4;
      if ((uVar6 / 3) * 3 + iVar5 == 0) {
        pwVar2[-2] = *(wchar_t *)(this + 8);
        lVar10 = -8;
      }
      *(int *)((long)pwVar2 + lVar10 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar9];
      if ((int)(uVar8 / 3) * 3 + iVar7 == 0) {
        *(undefined4 *)((long)pwVar2 + lVar10 + -8) = *(undefined4 *)(this + 8);
        lVar10 = lVar10 + -8;
      }
      else {
        lVar10 = lVar10 + -4;
      }
      pwVar2 = (wchar_t *)((long)pwVar2 + lVar10);
      iVar5 = iVar5 + -2;
      uVar6 = uVar6 + 2;
      iVar7 = iVar7 + -2;
      uVar8 = (ulong)((int)uVar8 + 2);
      uVar11 = uVar3 / 100;
    } while (9999 < uVar3);
    bVar12 = iVar5 + (uVar6 / 3) * 3 == 0;
    uVar11 = uVar3 / 100;
  }
  if (uVar11 < 10) {
    wVar4 = uVar11 | 0x30;
  }
  else {
    pwVar2[-1] = (int)(char)internal::basic_data<void>::DIGITS[((ulong)uVar11 * 2 & 0xffffffff) + 1]
    ;
    lVar10 = -4;
    if (bVar12) {
      pwVar2[-2] = *(wchar_t *)(this + 8);
      lVar10 = -8;
    }
    pwVar2 = (wchar_t *)((long)pwVar2 + lVar10);
    wVar4 = (wchar_t)(char)internal::basic_data<void>::DIGITS[(ulong)uVar11 * 2];
  }
  pwVar2[-1] = wVar4;
  *it = pwVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = format_decimal(it, abs_value, size,
                            internal::add_thousands_sep<char_type>(s));
      }